

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::reshapeTest(ViewTest *this)

{
  size_t j;
  long lVar1;
  size_t sVar2;
  reference pfVar3;
  reference pfVar4;
  size_t j_1;
  ulong value;
  bool local_1cd;
  float local_1cc;
  View<float,_false,_std::allocator<unsigned_long>_> v;
  size_t newShape_1 [2];
  View<float,_false,_std::allocator<unsigned_long>_> x;
  size_t newShape [2];
  View<float,_false,_std::allocator<unsigned_long>_> w;
  size_t shape [3];
  unsigned_long local_d0;
  size_t shape_1 [3];
  size_t base [3];
  float data [24];
  
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 1) {
    data[lVar1] = (float)lVar1;
  }
  shape[0] = 2;
  shape[1] = 4;
  shape[2] = 3;
  andres::View<float,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<float,false,std::allocator<unsigned_long>> *)&v,shape,&local_d0,data,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&w);
  andres::View<float,_false,_std::allocator<unsigned_long>_>::View(&w,&v);
  newShape[0] = 4;
  newShape[1] = 6;
  andres::View<float,false,std::allocator<unsigned_long>>::reshape<unsigned_long*>
            ((View<float,false,std::allocator<unsigned_long>> *)&v,newShape,(unsigned_long *)&w);
  sVar2 = andres::View<float,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  x.data_._0_1_ = sVar2 == 2;
  test((bool *)&x);
  x.data_._0_1_ = v.geometry_.size_ == 0x18;
  test((bool *)&x);
  sVar2 = andres::View<float,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
  x.data_._0_1_ = sVar2 == 4;
  test((bool *)&x);
  sVar2 = andres::View<float,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
  x.data_._0_1_ = sVar2 == 6;
  test((bool *)&x);
  x.data_._0_1_ = andres::View<float,_false,_std::allocator<unsigned_long>_>::isSimple(&v);
  test((bool *)&x);
  pfVar3 = andres::View<float,false,std::allocator<unsigned_long>>::operator()
                     ((View<float,false,std::allocator<unsigned_long>> *)&v,0);
  pfVar4 = andres::View<float,false,std::allocator<unsigned_long>>::operator()
                     ((View<float,false,std::allocator<unsigned_long>> *)&w,0);
  x.data_._0_1_ = pfVar3 == pfVar4;
  test((bool *)&x);
  for (value = 0; value < v.geometry_.size_; value = value + 1) {
    pfVar3 = andres::View<float,_false,_std::allocator<unsigned_long>_>::operator()(&v,value);
    local_1cc = *pfVar3;
    pfVar3 = andres::View<float,_false,_std::allocator<unsigned_long>_>::operator()(&w,value);
    x.data_._0_1_ = local_1cc == *pfVar3;
    test((bool *)&x);
  }
  base[0] = 0;
  base[1] = 1;
  base[2] = 1;
  shape_1[0] = 2;
  shape_1[1] = 3;
  shape_1[2] = 2;
  newShape_1[0] = 3;
  newShape_1[1] = 4;
  andres::View<float,false,std::allocator<unsigned_long>>::view<unsigned_long*,unsigned_long*>
            (&x,(View<float,false,std::allocator<unsigned_long>> *)&v,base,shape_1);
  andres::View<float,false,std::allocator<unsigned_long>>::reshape<unsigned_long*>
            ((View<float,false,std::allocator<unsigned_long>> *)&x,newShape_1,(unsigned_long *)&x);
  local_1cd = false;
  test(&local_1cd);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&x.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  return;
}

Assistant:

void ViewTest::reshapeTest()
{
    float data[24];
    for(std::size_t j=0; j<24; ++j) {
        data[j] = static_cast<float>(j);
    }
    std::size_t shape[] = {2, 4, 3};
    andres::View<float, false> v(&shape[0], &shape[3], data);
    andres::View<float, false> w = v; // copy
    
    std::size_t newShape[] = {4, 6};
    v.reshape(&newShape[0], &newShape[2]);

    test(v.dimension() == 2);
    test(v.size() == 24);
    test(v.shape(0) == 4);
    test(v.shape(1) == 6);
    test(v.isSimple());
    test(&v(0) == &w(0));
    for(std::size_t j=0; j<v.size(); ++j) {
        test(v(j) == w(j));
    }

    if(!andres::MARRAY_NO_DEBUG) {
        // negative test
        std::size_t base[] = {0, 1, 1};
        std::size_t shape[] = {2, 3, 2};
        std::size_t newShape[] = {3, 4};
        andres::View<float, false> x = v.view(base, shape);
        try {
            x.reshape(&newShape[0], &newShape[2]);
            test(0 == 1); // reshape should have thrown runtime_error
        }
        catch(std::runtime_error&) {}
    }
}